

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

void data_sheet_expat_callback_find_row_end(void *callbackdata,XML_Char *name)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  iVar2 = XML_Char_icmp_ins(name,"row");
  if (iVar2 != 0) {
    data_sheet_expat_callback_find_sheetdata_end(callbackdata,name);
    return;
  }
  uVar1 = *(uint *)((long)callbackdata + 0x44);
  if ((((uVar1 & 4) != 0) && (*(long *)((long)callbackdata + 0x10) == 1)) &&
     (*(long *)((long)callbackdata + 0x20) == 0)) {
    *(undefined8 *)((long)callbackdata + 0x20) = *(undefined8 *)((long)callbackdata + 0x18);
  }
  if (((-1 < (char)uVar1) && ((uVar1 & 2) == 0)) && (*(long *)((long)callbackdata + 0x78) != 0)) {
    uVar3 = *(ulong *)((long)callbackdata + 0x18);
    while (uVar3 < *(ulong *)((long)callbackdata + 0x20)) {
      iVar2 = (**(code **)((long)callbackdata + 0x78))
                        (*(undefined8 *)((long)callbackdata + 0x10),uVar3 + 1,0,
                         *(undefined8 *)((long)callbackdata + 0x80));
      if (iVar2 != 0) goto LAB_00104952;
      uVar3 = *(long *)((long)callbackdata + 0x18) + 1;
      *(ulong *)((long)callbackdata + 0x18) = uVar3;
    }
  }
  free(*(void **)((long)callbackdata + 0x30));
  *(undefined8 *)((long)callbackdata + 0x30) = 0;
  XML_SetElementHandler
            (*callbackdata,data_sheet_expat_callback_find_row_start,
             data_sheet_expat_callback_find_sheetdata_end);
  uVar1 = *(uint *)((long)callbackdata + 0x44);
  if ((char)uVar1 < '\0') {
    if (((uVar1 & 1) == 0) || (*(long *)((long)callbackdata + 0x28) != 0)) {
      uVar5 = *callbackdata;
      uVar4 = 1;
LAB_00104975:
      XML_StopParser(uVar5,uVar4);
      return;
    }
  }
  else if ((*(code **)((long)callbackdata + 0x70) != (code *)0x0) &&
          (((uVar1 & 1) == 0 || (*(long *)((long)callbackdata + 0x28) != 0)))) {
    iVar2 = (**(code **)((long)callbackdata + 0x70))
                      (*(undefined8 *)((long)callbackdata + 0x10),
                       *(undefined8 *)((long)callbackdata + 0x18),
                       *(undefined8 *)((long)callbackdata + 0x80));
    if (iVar2 != 0) {
LAB_00104952:
      uVar5 = *callbackdata;
      uVar4 = 0;
      goto LAB_00104975;
    }
  }
  return;
}

Assistant:

void data_sheet_expat_callback_find_row_end (void* callbackdata, const XML_Char* name)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("row")) == 0) {
    //determine number of columns based on first row
    if ((data->flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && data->rownr == 1 && data->cols == 0)
      data->cols = data->colnr;
    //add empty columns if needed
    if (!(data->flags & XLSXIOREAD_NO_CALLBACK) && data->sheet_cell_callback && !(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
      while (data->colnr < data->cols) {
        if ((*data->sheet_cell_callback)(data->rownr, data->colnr + 1, NULL, data->callbackdata)) {
          XML_StopParser(data->xmlparser, XML_FALSE);
          return;
        }
        data->colnr++;
      }
    }
    free(data->celldata);
    data->celldata = NULL;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_row_start, data_sheet_expat_callback_find_sheetdata_end);
    //process end of row
    if (!(data->flags & XLSXIOREAD_NO_CALLBACK)) {
      if (data->sheet_row_callback && !(data->colsnotnull == 0 && (data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS))) {
        if ((*data->sheet_row_callback)(data->rownr, data->colnr, data->callbackdata)) {
          XML_StopParser(data->xmlparser, XML_FALSE);
          return;
        }
      }
    } else {
      //for non-calback method suspend here on end of row
      if (!(data->colsnotnull == 0 && (data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS)))
        XML_StopParser(data->xmlparser, XML_TRUE);
    }
  } else {
    data_sheet_expat_callback_find_sheetdata_end(callbackdata, name);
  }
}